

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

void __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
::tuple_base(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
             *this,tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                   *param_1)

{
  bool *pbVar1;
  tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false> *ptVar2;
  bool *pbVar3;
  
  (this->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>).value
  .val_._M_dataplus._M_p =
       (pointer)&(this->
                 super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
                 ).value.val_.field_2;
  (this->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>).value
  .val_._M_string_length = 0;
  (this->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>).value
  .val_.field_2._M_local_buf[0] = '\0';
  (this->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>).value
  .empty_ = false;
  if ((param_1->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
      ).value.empty_ == false) {
    ptVar2 = &param_1->
              super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1);
    (this->super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>).
    value.empty_ = false;
  }
  else {
    ptVar2 = &this->
              super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>;
  }
  (ptVar2->value).empty_ = true;
  (this->super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).value
  .val_._M_dataplus._M_p =
       (pointer)&(this->
                 super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
                 ).value.val_.field_2;
  (this->super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).value
  .val_._M_string_length = 0;
  (this->super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).value
  .val_.field_2._M_local_buf[0] = '\0';
  pbVar1 = &(this->
            super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).
            value.empty_;
  (this->super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).value
  .empty_ = false;
  pbVar3 = pbVar1;
  if ((param_1->super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
      ).value.empty_ == false) {
    pbVar3 = &(param_1->
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>).
              value.empty_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->
                super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &param_1->
                 super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
              );
    *pbVar1 = false;
  }
  *pbVar3 = true;
  return;
}

Assistant:

tuple_base( tuple_base&& ) = default;